

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
* myvk::CommandBuffer::CreateMultiple
            (vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
             *__return_storage_ptr__,Ptr<CommandPool> *command_pool,uint32_t count,
            VkCommandBufferLevel level)

{
  PFN_vkAllocateCommandBuffers p_Var1;
  int iVar2;
  VkResult VVar3;
  undefined4 extraout_var;
  long lVar4;
  uint32_t i;
  ulong uVar5;
  ulong __n;
  shared_ptr<myvk::CommandBuffer> ptr;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> handles;
  __shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2> local_80;
  _Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> local_70;
  VkCommandBufferAllocateInfo local_58;
  
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_58._4_4_ = 0;
  local_58.commandPool =
       ((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_command_pool;
  __n = (ulong)count;
  local_58.level = level;
  local_58.commandBufferCount = count;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)&local_70,__n,
             (allocator_type *)&local_80);
  p_Var1 = vkAllocateCommandBuffers;
  iVar2 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar3 = (*p_Var1)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x268),&local_58,
                    local_70._M_impl.super__Vector_impl_data._M_start);
  if (VVar3 == VK_SUCCESS) {
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::vector(__return_storage_ptr__,__n,(allocator_type *)&local_80);
    lVar4 = 0;
    for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
      std::make_shared<myvk::CommandBuffer>();
      std::__shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_80._M_ptr)->m_command_pool_ptr).
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>,
                 &command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>);
      (local_80._M_ptr)->m_command_buffer = local_70._M_impl.super__Vector_impl_data._M_start[uVar5]
      ;
      std::__shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar4),&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      lVar4 = lVar4 + 0x10;
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::_Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~_Vector_base
            (&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<CommandBuffer>> CommandBuffer::CreateMultiple(const Ptr<CommandPool> &command_pool, uint32_t count,
                                                              VkCommandBufferLevel level) {
	VkCommandBufferAllocateInfo alloc_info = {};
	alloc_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
	alloc_info.commandPool = command_pool->GetHandle();
	alloc_info.level = level;
	alloc_info.commandBufferCount = count;

	std::vector<VkCommandBuffer> handles(count);

	if (vkAllocateCommandBuffers(command_pool->GetDevicePtr()->GetHandle(), &alloc_info, handles.data()) != VK_SUCCESS)
		return {};

	std::vector<Ptr<CommandBuffer>> ret(count);
	for (uint32_t i = 0; i < count; ++i) {
		auto ptr = std::make_shared<CommandBuffer>();
		ptr->m_command_pool_ptr = command_pool;
		ptr->m_command_buffer = handles[i];
		ret[i] = ptr;
	}

	return ret;
}